

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

int Matvec_SparseCSR(SUNMatrix A,N_Vector x,N_Vector y)

{
  void *pvVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  realtype *prVar7;
  realtype *__s;
  long lVar8;
  int iVar9;
  long lVar10;
  realtype rVar11;
  
  pvVar1 = A->content;
  plVar2 = *(long **)((long)pvVar1 + 0x38);
  lVar3 = *(long *)((long)pvVar1 + 0x20);
  lVar4 = *(long *)((long)pvVar1 + 0x30);
  iVar9 = 1;
  if (lVar3 != 0 && (lVar4 != 0 && plVar2 != (long *)0x0)) {
    prVar7 = N_VGetArrayPointer(x);
    __s = N_VGetArrayPointer(y);
    if (prVar7 != __s && (__s != (realtype *)0x0 && prVar7 != (realtype *)0x0)) {
      lVar5 = *A->content;
      if (0 < lVar5) {
        lVar10 = 0;
        memset(__s,0,lVar5 * 8);
        lVar8 = *plVar2;
        do {
          lVar6 = plVar2[lVar10 + 1];
          if (lVar8 < lVar6) {
            rVar11 = __s[lVar10];
            do {
              rVar11 = rVar11 + *(double *)(lVar3 + lVar8 * 8) *
                                prVar7[*(long *)(lVar4 + lVar8 * 8)];
              __s[lVar10] = rVar11;
              lVar8 = lVar8 + 1;
            } while (lVar6 != lVar8);
          }
          lVar10 = lVar10 + 1;
          lVar8 = lVar6;
        } while (lVar10 != lVar5);
      }
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int Matvec_SparseCSR(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Aj;
  realtype *Ax, *xd, *yd;

  /* access data from CSR structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Aj = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Aj == NULL) || (Ax == NULL))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd))
    return 1;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix rows */
  for (i=0; i<SM_ROWS_S(A); i++) {

    /* iterate along row of A, performing product */
    for (j=Ap[i]; j<Ap[i+1]; j++)
      yd[i] += Ax[j]*xd[Aj[j]];

  }

  return(0);
}